

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglThreadCleanUpTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::anon_unknown_0::ThreadCleanUpTest::ThreadCleanUpTest
          (ThreadCleanUpTest *this,EglTestContext *eglTestCtx,ContextType contextType,
          SurfaceType surfaceType)

{
  string name;
  char *local_48;
  undefined8 local_40;
  char local_38;
  undefined7 uStack_37;
  
  local_40 = 0;
  local_38 = '\0';
  local_48 = &local_38;
  std::__cxx11::string::append((char *)&local_48);
  std::__cxx11::string::append((char *)&local_48);
  TestCase::TestCase(&this->super_TestCase,eglTestCtx,local_48,"Simple thread context clean up test"
                    );
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ThreadCleanUpTest_0211b700;
  this->m_contextType = contextType;
  this->m_surfaceType = surfaceType;
  this->m_iterCount = 0xfa;
  this->m_iterNdx = 0;
  this->m_display = (EGLDisplay)0x0;
  this->m_config = (EGLConfig)0x0;
  this->m_surface = (EGLSurface)0x0;
  this->m_context = (EGLContext)0x0;
  return;
}

Assistant:

ThreadCleanUpTest (EglTestContext& eglTestCtx, ContextType contextType, SurfaceType surfaceType)
		: TestCase			(eglTestCtx, testCaseName(contextType, surfaceType).c_str(), "Simple thread context clean up test")
		, m_contextType		(contextType)
		, m_surfaceType		(surfaceType)
		, m_iterCount		(250)
		, m_iterNdx			(0)
		, m_display			(EGL_NO_DISPLAY)
		, m_config			(0)
		, m_surface			(EGL_NO_SURFACE)
		, m_context			(EGL_NO_CONTEXT)
	{
	}